

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall sf::Image::flipVertically(Image *this)

{
  pointer puVar1;
  ulong uVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first1;
  ulong uVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first2;
  
  __first1._M_current =
       (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  puVar1 = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__first1._M_current != puVar1) {
    uVar3 = (ulong)((this->m_size).x << 2);
    __first2._M_current = puVar1 + -uVar3;
    for (uVar2 = 0; uVar2 < (this->m_size).y >> 1; uVar2 = uVar2 + 1) {
      std::
      swap_ranges<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (__first1,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )(__first1._M_current + uVar3),__first2);
      __first2._M_current = __first2._M_current + -uVar3;
      __first1._M_current = __first1._M_current + uVar3;
    }
  }
  return;
}

Assistant:

void Image::flipVertically()
{
    if (!m_pixels.empty())
    {
        std::vector<Uint8>::iterator::difference_type rowSize = static_cast<std::vector<Uint8>::iterator::difference_type>(m_size.x * 4);

        std::vector<Uint8>::iterator top = m_pixels.begin();
        std::vector<Uint8>::iterator bottom = m_pixels.end() - rowSize;

        for (std::size_t y = 0; y < m_size.y / 2; ++y)
        {
            std::swap_ranges(top, top + rowSize, bottom);

            top += rowSize;
            bottom -= rowSize;
        }
    }
}